

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall hypermind::Token::dump(Token *this,Ostream *os)

{
  char *pcVar1;
  String name;
  char *local_60;
  long local_58;
  char local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_58 = 0;
  local_50[0] = '\0';
  local_60 = local_50;
  switch(this->type) {
  case End:
    pcVar1 = "<end>";
    break;
  case Delimiter:
    pcVar1 = "<delimiter>";
    break;
  case Number:
  case Identifier:
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,this->start,this->start + this->length);
    std::__cxx11::string::operator=((string *)&local_60,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  case String:
    goto switchD_0010b773_caseD_3;
  case Dot:
    pcVar1 = ".";
    break;
  case Comma:
    pcVar1 = ",";
    break;
  case LeftParen:
    pcVar1 = "(";
    break;
  case RightParen:
    pcVar1 = ")";
    break;
  case LeftBracket:
    pcVar1 = "[";
    break;
  case RightBracket:
    pcVar1 = "]";
    break;
  case LeftBrace:
    pcVar1 = "{";
    break;
  case RightBrace:
    pcVar1 = "}";
    break;
  case Add:
    pcVar1 = "+";
    break;
  case Sub:
    pcVar1 = "-";
    break;
  case Mul:
    pcVar1 = "*";
    break;
  case Div:
    pcVar1 = "/";
    break;
  case Increase:
    pcVar1 = "++";
    break;
  case Decrease:
    pcVar1 = "--";
    break;
  case Assign:
    pcVar1 = "=";
    break;
  case AddAssign:
    pcVar1 = "+=";
    break;
  case SubAssign:
    pcVar1 = "-=";
    break;
  case MulAssign:
    pcVar1 = "*=";
    break;
  case DivAssign:
    pcVar1 = "/=";
    break;
  case ModAssign:
    pcVar1 = "%=";
    break;
  case AndAssign:
    pcVar1 = "&=";
    break;
  case OrAssign:
    pcVar1 = "|=";
    break;
  case XorAssign:
    pcVar1 = "^=";
    break;
  case Arrow:
    pcVar1 = "->";
    break;
  case Not:
    pcVar1 = "!";
    break;
  case Equal:
    pcVar1 = "==";
    break;
  case NotEqual:
    pcVar1 = "!=";
    break;
  case Greater:
    pcVar1 = ">";
    break;
  case Less:
    pcVar1 = "<";
    break;
  case GreaterEqual:
    pcVar1 = ">=";
    break;
  case LessEqual:
    pcVar1 = "<=";
    break;
  case Or:
    pcVar1 = "|";
    break;
  case LogicOr:
    pcVar1 = "||";
    break;
  case And:
    pcVar1 = "&";
    break;
  case LogicAnd:
    pcVar1 = "&&";
    break;
  case Mod:
    pcVar1 = "%";
    break;
  case At:
    pcVar1 = "@";
    break;
  case Colon:
    pcVar1 = ":";
    break;
  default:
    pcVar1 = "<unknown>";
    break;
  case KeywordNew:
    pcVar1 = "new";
  }
  std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,(ulong)pcVar1);
switchD_0010b773_caseD_3:
  std::__ostream_insert<char,std::char_traits<char>>(os,local_60,local_58);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void Token::dump(Ostream &os) const {
#define TOKEN_DUMP(v) name = _HM_C(v);
        String name;
        switch (type) {
            case TokenType::End:
                TOKEN_DUMP("<end>");
                break;
            case TokenType::Delimiter:
                TOKEN_DUMP("<delimiter>");
                break;
            case TokenType::Add:
                TOKEN_DUMP("+");
                break;
            case TokenType::Sub:
                TOKEN_DUMP("-");
                break;
            case TokenType::Mul:
                TOKEN_DUMP("*");
                break;
            case TokenType::Div:
                TOKEN_DUMP("/");
                break;
            case TokenType::Identifier:
            case TokenType::Number:
                name = String(start, length);
                break;
            case TokenType::String:
                break;
            case TokenType::Dot:
                TOKEN_DUMP(".");
                break;
            case TokenType::Comma:
                TOKEN_DUMP(",");
                break;
            case TokenType::LeftParen:
                TOKEN_DUMP("(");
                break;
            case TokenType::RightParen:
                TOKEN_DUMP(")");
                break;
            case TokenType::LeftBracket:
                TOKEN_DUMP("[");
                break;
            case TokenType::RightBracket:
                TOKEN_DUMP("]");
                break;
            case TokenType::LeftBrace:
                TOKEN_DUMP("{");
                break;
            case TokenType::RightBrace:
                TOKEN_DUMP("}");
                break;
            case TokenType::Increase:
                TOKEN_DUMP("++");
                break;
            case TokenType::Decrease:
                TOKEN_DUMP("--");
                break;
            case TokenType::Assign:
                TOKEN_DUMP("=");
                break;
            case TokenType::AddAssign:
                TOKEN_DUMP("+=");
                break;
            case TokenType::SubAssign:
                TOKEN_DUMP("-=");
                break;
            case TokenType::MulAssign:
                TOKEN_DUMP("*=");
                break;
            case TokenType::DivAssign:
                TOKEN_DUMP("/=");
                break;
            case TokenType::ModAssign:
                TOKEN_DUMP("%=");
                break;
            case TokenType::AndAssign:
                TOKEN_DUMP("&=");
                break;
            case TokenType::OrAssign:
                TOKEN_DUMP("|=");
                break;
            case TokenType::XorAssign:
                TOKEN_DUMP("^=");
                break;
            case TokenType::Arrow:
                TOKEN_DUMP("->");
                break;
            case TokenType::Not:
                TOKEN_DUMP("!");
                break;
            case TokenType::Equal:
                TOKEN_DUMP("==");
                break;
            case TokenType::NotEqual:
                TOKEN_DUMP("!=");
                break;
            case TokenType::Greater:
                TOKEN_DUMP(">");
                break;
            case TokenType::Less:
                TOKEN_DUMP("<");
                break;
            case TokenType::GreaterEqual:
                TOKEN_DUMP(">=");
                break;
            case TokenType::LessEqual:
                TOKEN_DUMP("<=");
                break;
            case TokenType::Or:
                TOKEN_DUMP("|");
                break;
            case TokenType::LogicOr:
                TOKEN_DUMP("||");
                break;
            case TokenType::And:
                TOKEN_DUMP("&");
                break;
            case TokenType::LogicAnd:
                TOKEN_DUMP("&&");
                break;
            case TokenType::Mod:
                TOKEN_DUMP("%");
                break;
            case TokenType::At:
                TOKEN_DUMP("@");
                break;
            case TokenType::Colon:
                TOKEN_DUMP(":");
                break;
            case TokenType::KeywordNew:
                TOKEN_DUMP("new");
                break;
            default:
                TOKEN_DUMP("<unknown>");
        }
        os << name ;
#undef TOKEN_DUMP

    }